

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O2

void EDLines::LineFit(double *x,double *y,int count,double *a,double *b,double *e,int *invert)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (1 < count) {
    uVar2 = (ulong)(uint)count;
    dVar5 = 0.0;
    dVar6 = 0.0;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dVar5 = dVar5 + y[uVar4];
      dVar6 = dVar6 + x[uVar4];
    }
    dVar7 = (double)count;
    auVar10._8_8_ = dVar6;
    auVar10._0_8_ = dVar5;
    auVar11._8_8_ = dVar7;
    auVar11._0_8_ = dVar7;
    auVar11 = divpd(auVar10,auVar11);
    dVar8 = 0.0;
    dVar9 = 0.0;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dVar12 = y[uVar4] - auVar11._0_8_;
      dVar13 = x[uVar4] - auVar11._8_8_;
      dVar8 = dVar8 + dVar12 * dVar12;
      dVar9 = dVar9 + dVar13 * dVar13;
    }
    pdVar3 = x;
    dVar12 = dVar5;
    if (dVar9 < dVar8) {
      pdVar3 = y;
      dVar12 = dVar6;
      y = x;
    }
    *invert = (uint)(dVar9 < dVar8);
    dVar13 = 0.0;
    dVar14 = 0.0;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dVar1 = pdVar3[uVar4];
      dVar13 = dVar13 + dVar1 * dVar1;
      dVar14 = dVar14 + y[uVar4] * dVar1;
    }
    dVar9 = (double)(~-(ulong)(dVar9 < dVar8) & (ulong)dVar6 |
                    -(ulong)(dVar9 < dVar8) & (ulong)dVar5);
    dVar8 = dVar7 * dVar13 - dVar9 * dVar9;
    *a = (dVar12 * dVar13 - dVar9 * dVar14) / dVar8;
    dVar8 = (dVar14 * dVar7 - dVar6 * dVar5) / dVar8;
    *b = dVar8;
    dVar5 = 0.0;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        dVar6 = (*a - (-(-1.0 / dVar8) * pdVar3[uVar4] + y[uVar4])) / (-1.0 / dVar8 - dVar8);
        dVar9 = pdVar3[uVar4] - dVar6;
        dVar6 = y[uVar4] - (dVar8 * dVar6 + *a);
        dVar5 = dVar5 + dVar9 * dVar9 + dVar6 * dVar6;
      }
      dVar5 = dVar5 / dVar7;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
    }
    else {
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        dVar5 = dVar5 + ABS(*a - y[uVar4]);
      }
      dVar5 = dVar5 / dVar7;
    }
    *e = dVar5;
  }
  return;
}

Assistant:

void EDLines::LineFit(double * x, double * y, int count, double &a, double &b, double &e, int &invert)
{
	if (count<2) return;

	double S = count, Sx = 0.0, Sy = 0.0, Sxx = 0.0, Sxy = 0.0;
	for (int i = 0; i<count; i++) {
		Sx += x[i];
		Sy += y[i];
	} //end-for

	double mx = Sx / count;
	double my = Sy / count;

	double dx = 0.0;
	double dy = 0.0;
	for (int i = 0; i < count; i++) {
		dx += (x[i] - mx)*(x[i] - mx);
		dy += (y[i] - my)*(y[i] - my);
	} //end-for

	if (dx < dy) {
		// Vertical line. Swap x & y, Sx & Sy
		invert = 1;
		double *t = x;
		x = y;
		y = t;

		double d = Sx;
		Sx = Sy;
		Sy = d;

	}
	else {
		invert = 0;
	} //end-else  

	  // Now compute Sxx & Sxy
	for (int i = 0; i<count; i++) {
		Sxx += x[i] * x[i];
		Sxy += x[i] * y[i];
	} //end-for

	double D = S*Sxx - Sx*Sx;
	a = (Sxx*Sy - Sx*Sxy) / D;
	b = (S  *Sxy - Sx* Sy) / D;

	if (b == 0.0) {
		// Vertical or horizontal line
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			error += fabs((a) - y[i]);
		} //end-for
		e = error / count;

	}
	else {
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			// Let the line passing through (x[i], y[i]) that is perpendicular to a+bx be c+dx
			double d = -1.0 / (b);
			double c = y[i] - d*x[i];
			double x2 = ((a) - c) / (d - (b));
			double y2 = (a) + (b)*x2;

			double dist = (x[i] - x2)*(x[i] - x2) + (y[i] - y2)*(y[i] - y2);
			error += dist;
		} //end-for

		e = sqrt(error / count);
	} //end-else
}